

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmrandgen.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  int iVar1;
  long lVar2;
  int local_38;
  int i;
  allocator<char> local_21;
  char **local_20;
  char **argv_local;
  CommandOptions *pCStack_10;
  int argc_local;
  CommandOptions *this_local;
  
  this->error_flag = true;
  this->no_newline_flag = false;
  this->verbose_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->format = OF_HEX;
  this->request_size = 0x20;
  this->size_provided = false;
  local_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->separator,"-",&local_21);
  std::allocator<char>::~allocator(&local_21);
  local_38 = 1;
  do {
    if (argv_local._4_4_ <= local_38) {
      if (((this->help_flag & 1U) == 0) && ((this->version_flag & 1U) == 0)) {
        if ((this->size_provided & 1U) == 0) {
          if (this->format == OF_CODEWORD) {
            this->request_size = 0x14;
          }
          else if (this->format == OF_DICTWORD) {
            this->request_size = 0x10;
          }
        }
        else if (this->request_size == 0) {
          fprintf(_stderr,"Please use a non-zero request size\n");
          return;
        }
        this->error_flag = false;
      }
      return;
    }
    iVar1 = strcmp(local_20[local_38],"-help");
    if (iVar1 == 0) {
      this->help_flag = true;
    }
    else {
      if (((*local_20[local_38] != '-') || (iVar1 = isalpha((int)local_20[local_38][1]), iVar1 == 0)
          ) || (local_20[local_38][2] != '\0')) {
        fprintf(_stderr,"Unrecognized option: %s\n",local_20[local_38]);
        return;
      }
      switch(local_20[local_38][1]) {
      case 'B':
        this->format = OF_BASE64;
        break;
      case 'C':
        this->format = OF_CODEWORD;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %s\n",local_20[local_38]);
        return;
      case 'V':
        this->version_flag = true;
        break;
      case 'W':
        local_38 = local_38 + 1;
        if ((argv_local._4_4_ <= local_38) || (*local_20[local_38] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x57);
          return;
        }
        std::__cxx11::string::operator=((string *)&this->separator,local_20[local_38]);
        break;
      case 'b':
        this->format = OF_BINARY;
        break;
      case 'c':
        this->format = OF_CSTRUCT;
        break;
      case 'h':
        this->help_flag = true;
        break;
      case 'n':
        this->no_newline_flag = true;
        break;
      case 's':
        local_38 = local_38 + 1;
        if ((argv_local._4_4_ <= local_38) || (*local_20[local_38] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x73);
          return;
        }
        lVar2 = strtol(local_20[local_38],(char **)0x0,10);
        lVar2 = Kumu::xabs<long>(lVar2);
        this->request_size = (ui32_t)lVar2;
        this->size_provided = true;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      case 'w':
        this->format = OF_DICTWORD;
        break;
      case 'x':
        this->format = OF_HEX;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), no_newline_flag(false), verbose_flag(false),
    version_flag(false), help_flag(false), format(OF_HEX), request_size(RandBlockSize*2),
    size_provided(false), separator("-")
  {
    for ( int i = 1; i < argc; i++ )
      {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
     
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'b': format = OF_BINARY; break;
	      case 'B': format = OF_BASE64; break;
	      case 'c': format = OF_CSTRUCT; break;
	      case 'C': format = OF_CODEWORD; break;
	      case 'n': no_newline_flag = true; break;
	      case 'h': help_flag = true; break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		request_size = Kumu::xabs(strtol(argv[i], 0, 10));
		size_provided = true;
		break;

	      case 'v': verbose_flag = true; break;
	      case 'V': version_flag = true; break;
	      case 'w': format = OF_DICTWORD; break;

	      case 'W':
		TEST_EXTRA_ARG(i, 'W');
		separator = argv[i];
		break;

	      case 'x': format = OF_HEX; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
	    return;
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( ! size_provided )
      {
	if ( format == OF_CODEWORD )
	  {
	    request_size = 20;
	  }
	else if ( format == OF_DICTWORD )
	  {
	    request_size = 16;
	  }
      }
    else if ( request_size == 0 )
      {
	fprintf(stderr, "Please use a non-zero request size\n");
	return;
      }

    error_flag = false;
  }